

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O2

int XPMP2::SoundLoadXPSounds(void)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char *pcVar8;
  byte *pbVar9;
  uint uVar10;
  int iVar11;
  undefined1 auVar12 [16];
  
  pcVar8 = XPMPSoundAdd("Electric","Resources/sounds/engine/ENGINE_ELECTRIC_out.wav",true,NAN,NAN,
                        NAN,NAN,NAN);
  cVar1 = *pcVar8;
  pcVar8 = XPMPSoundAdd("HiBypassJet","Resources/sounds/engine/ENGINE_HI_BYPASS_JET_out.wav",true,
                        180.0,0.0,30.0,60.0,0.5);
  uVar10 = (cVar1 == '\0') + 1;
  if (*pcVar8 != '\0') {
    uVar10 = (uint)(cVar1 == '\0');
  }
  pbVar9 = (byte *)XPMPSoundAdd("LoBypassJet","Resources/sounds/engine/ENGINE_LO_BYPASS_JET_out.wav"
                                ,true,180.0,0.0,30.0,60.0,0.5);
  bVar2 = *pbVar9;
  pbVar9 = (byte *)XPMPSoundAdd("Turboprop","Resources/sounds/engine/ENGINE_TURBOPROP_out.wav",true,
                                NAN,NAN,NAN,NAN,NAN);
  bVar3 = *pbVar9;
  pcVar8 = XPMPSoundAdd("PropAirplane","Resources/sounds/engine/PROPELLER_OF_AIRPLANE_out.wav",true,
                        NAN,NAN,NAN,NAN,NAN);
  cVar1 = *pcVar8;
  pcVar8 = XPMPSoundAdd("PropHeli","Resources/sounds/engine/PROPELLER_OF_HELO_out.wav",true,NAN,NAN,
                        NAN,NAN,NAN);
  cVar4 = *pcVar8;
  pcVar8 = XPMPSoundAdd("ReverseThrust","Resources/sounds/engine/REVERSE_THRUST_out.wav",true,NAN,
                        NAN,NAN,NAN,NAN);
  cVar5 = *pcVar8;
  pcVar8 = XPMPSoundAdd("RollRunway","Resources/sounds/contact/roll_runway.wav",true,NAN,NAN,NAN,NAN
                        ,NAN);
  cVar6 = *pcVar8;
  pcVar8 = XPMPSoundAdd("Flap","Resources/sounds/systems/flap.wav",false,NAN,NAN,NAN,NAN,NAN);
  cVar7 = *pcVar8;
  pcVar8 = XPMPSoundAdd("Gear","Resources/sounds/systems/gear.wav",false,NAN,NAN,NAN,NAN,NAN);
  iVar11 = (uint)bVar3 * 0x100 + (uint)bVar2;
  auVar12[0] = -((char)iVar11 == '\0');
  auVar12[1] = -((char)((uint)iVar11 >> 8) == '\0');
  auVar12[2] = -(cVar1 == '\0' && (char)((uint)iVar11 >> 0x10) == '\0');
  auVar12[3] = -(cVar4 == '\0');
  auVar12[4] = -(cVar5 == '\0');
  auVar12[5] = -(cVar6 == '\0');
  auVar12[6] = -(cVar7 == '\0');
  auVar12[7] = -(*pcVar8 == '\0');
  auVar12[8] = 0xff;
  auVar12[9] = 0xff;
  auVar12[10] = 0xff;
  auVar12[0xb] = 0xff;
  auVar12[0xc] = 0xff;
  auVar12[0xd] = 0xff;
  auVar12[0xe] = 0xff;
  auVar12[0xf] = 0xff;
  return (((uint)(byte)(SUB161(auVar12 >> 7,0) & 1 | (SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                        (SUB161(auVar12 >> 0x17,0) & 1) << 2 | (SUB161(auVar12 >> 0x1f,0) & 1) << 3
                        | (SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                        (SUB161(auVar12 >> 0x2f,0) & 1) << 5 | (SUB161(auVar12 >> 0x37,0) & 1) << 6
                       | SUB161(auVar12 >> 0x3f,0) << 7) * 0x8040201 >> 3 & 0x11111111) * 0x11111111
         >> 0x1c) + uVar10;
}

Assistant:

int SoundLoadXPSounds ()
{
    int n = 0;
#define ADD_SND(s,f,l) if (!XPMPSoundAdd(s,f,l)[0]) ++n;
#define ADD_CONE(s,f,l,cd,cp,cia,coa,cov) if (!XPMPSoundAdd(s,f,l,cd,cp,cia,coa,cov)[0]) ++n;
    // Engine sounds
    ADD_SND(XP_SOUND_ELECTRIC,          "Resources/sounds/engine/ENGINE_ELECTRIC_out.wav",          true);
    // The two jet sounds define a sound cone: 180 degrees heading (ie. backwards), no pitch, with 30 degree inner angle (full sound), and 60 degree outer angle (reduced sound), with sound reduction to 50% outside the outer angle:
    ADD_CONE(XP_SOUND_HIBYPASSJET,      "Resources/sounds/engine/ENGINE_HI_BYPASS_JET_out.wav",     true, 180.0f, 0.0f, 30.0f, 60.0f, 0.5f);
    ADD_CONE(XP_SOUND_LOBYPASSJET,      "Resources/sounds/engine/ENGINE_LO_BYPASS_JET_out.wav",     true, 180.0f, 0.0f, 30.0f, 60.0f, 0.5f);
    ADD_SND(XP_SOUND_TURBOPROP,         "Resources/sounds/engine/ENGINE_TURBOPROP_out.wav",         true);
    ADD_SND(XP_SOUND_PROP_AIRPLANE,     "Resources/sounds/engine/PROPELLER_OF_AIRPLANE_out.wav",    true);
    ADD_SND(XP_SOUND_PROP_HELI,         "Resources/sounds/engine/PROPELLER_OF_HELO_out.wav",        true);
    ADD_SND(XP_SOUND_REVERSE_THRUST,    "Resources/sounds/engine/REVERSE_THRUST_out.wav",           true);
    
    // Rolling on the ground
    ADD_SND(XP_SOUND_ROLL_RUNWAY,       "Resources/sounds/contact/roll_runway.wav",                 true);
    
    // One-time sounds
    ADD_SND(XP_SOUND_FLAP,              "Resources/sounds/systems/flap.wav",                        false);
    ADD_SND(XP_SOUND_GEAR,              "Resources/sounds/systems/gear.wav",                        false);
    return n;
}